

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void simple_light(void)

{
  shared_ptr<diffuse_light> difflight;
  shared_ptr<noise_texture> pertext;
  hittable_list world;
  undefined1 local_299;
  vec3 local_298;
  quad *local_280;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_278;
  shared_ptr<diffuse_light> local_270;
  vec3 local_260;
  shared_ptr<noise_texture> local_248;
  shared_ptr<hittable> local_238;
  shared_ptr<hittable> local_228;
  shared_ptr<hittable> local_218;
  shared_ptr<hittable> local_208;
  hittable_list local_1f8;
  undefined1 local_1a8 [16];
  double local_198;
  double local_190;
  double dStack_188;
  double local_180;
  double local_178;
  double local_170;
  double dStack_168;
  double local_160;
  double dStack_158;
  double local_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  undefined1 local_108 [216];
  
  local_1f8.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001293b0;
  local_1f8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.bbox.x.min = INFINITY;
  local_1f8.bbox.x.max = -INFINITY;
  local_1f8.bbox.y.min = INFINITY;
  local_1f8.bbox.y.max = -INFINITY;
  local_1f8.bbox.z.min = INFINITY;
  local_1f8.bbox.z.max = -INFINITY;
  local_1a8._0_4_ = 4;
  local_248.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<noise_texture,std::allocator<noise_texture>,int>
            (&local_248.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (noise_texture **)&local_248,(allocator<noise_texture> *)&local_298,(int *)local_1a8);
  local_1a8._0_8_ = 0.0;
  local_1a8._8_8_ = -1000.0;
  local_198 = 0.0;
  local_270.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_270.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
                ,1000);
  local_260.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<noise_texture>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260.e + 1),
             (lambertian **)&local_260,(allocator<lambertian> *)&local_280,&local_248);
  local_298.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298.e + 1),(sphere **)&local_298,
             (allocator<sphere> *)&local_280,(vec3 *)local_1a8,(int *)&local_270,
             (shared_ptr<lambertian> *)&local_260);
  local_208.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_298.e[0];
  local_208.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1];
  local_298.e[0] = 0.0;
  local_298.e[1] = 0.0;
  hittable_list::add(&local_1f8,&local_208);
  if (local_208.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260.e[1]);
  }
  local_1a8._0_8_ = 0.0;
  local_1a8._8_8_ = 2.0;
  local_198 = 0.0;
  local_270.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_270.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
                ,2);
  local_260.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<noise_texture>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260.e + 1),
             (lambertian **)&local_260,(allocator<lambertian> *)&local_280,&local_248);
  local_298.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298.e + 1),(sphere **)&local_298,
             (allocator<sphere> *)&local_280,(vec3 *)local_1a8,(int *)&local_270,
             (shared_ptr<lambertian> *)&local_260);
  local_218.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_298.e[0];
  local_218.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1];
  local_298.e[0] = 0.0;
  local_298.e[1] = 0.0;
  hittable_list::add(&local_1f8,&local_218);
  if (local_218.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260.e[1]);
  }
  local_1a8._0_8_ = 4.0;
  local_1a8._8_8_ = 4.0;
  local_198 = 4.0;
  local_270.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<diffuse_light,std::allocator<diffuse_light>,vec3>
            (&local_270.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (diffuse_light **)&local_270,(allocator<diffuse_light> *)&local_298,(vec3 *)local_1a8);
  local_1a8._0_8_ = 0.0;
  local_1a8._8_8_ = 7.0;
  local_198 = 0.0;
  local_260.e[0] = (double)CONCAT44(local_260.e[0]._4_4_,2);
  local_298.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<diffuse_light>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298.e + 1),(sphere **)&local_298,
             (allocator<sphere> *)&local_280,(vec3 *)local_1a8,(int *)&local_260,&local_270);
  local_228.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_298.e[0];
  local_228.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1];
  local_298.e[0] = 0.0;
  local_298.e[1] = 0.0;
  hittable_list::add(&local_1f8,&local_228);
  if (local_228.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
  }
  local_1a8._0_8_ = 3.0;
  local_1a8._8_8_ = 1.0;
  local_198 = -2.0;
  local_298.e[0] = 2.0;
  local_298.e[1] = 0.0;
  local_298.e[2] = 0.0;
  local_260.e[0] = 0.0;
  local_260.e[1] = 2.0;
  local_260.e[2] = 0.0;
  local_280 = (quad *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3,vec3,std::shared_ptr<diffuse_light>&>
            (&_Stack_278,&local_280,(allocator<quad> *)&local_299,(vec3 *)local_1a8,&local_298,
             &local_260,&local_270);
  local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_280->super_hittable;
  local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_278._M_pi;
  local_280 = (quad *)0x0;
  _Stack_278._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add(&local_1f8,&local_238);
  if (local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (_Stack_278._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_278._M_pi);
  }
  local_1a8._0_8_ = 1.0;
  local_1a8._8_8_ = 2.12199579590593e-313;
  local_198._0_4_ = 10;
  local_190 = 0.0;
  dStack_188 = 0.0;
  local_180 = 0.0;
  local_178 = 90.0;
  local_170 = 0.0;
  dStack_168 = 0.0;
  local_160 = 0.0;
  dStack_158 = 0.0;
  local_150 = 0.0;
  local_148 = -1.0;
  dStack_140 = 0.0;
  local_138 = 1.0;
  local_130 = 0.0;
  dStack_128 = 0.0;
  local_120 = 10.0;
  memset(local_108,0,0xd8);
  local_1a8._0_8_ = 1.7777777777777777;
  local_1a8._8_8_ = 2.12199579294153e-312;
  local_198 = (double)CONCAT44(local_198._4_4_,0x32);
  local_190 = 0.0;
  dStack_188 = 0.0;
  local_180 = 0.0;
  local_178 = 20.0;
  local_170 = 26.0;
  dStack_168 = 3.0;
  local_160 = 6.0;
  dStack_158 = 0.0;
  local_150 = 2.0;
  local_148 = 0.0;
  dStack_140 = 0.0;
  local_138 = 1.0;
  local_130 = 0.0;
  dStack_128 = 0.0;
  camera::render((camera *)local_1a8,&local_1f8.super_hittable);
  if (local_270.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_248.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_1f8.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001293b0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::~vector
            (&local_1f8.objects);
  return;
}

Assistant:

void bouncing_spheres() {
    hittable_list world;

    auto checker = make_shared<checker_texture>(0.32, color(.2, .3, .1), color(.9, .9, .9));
    world.add(make_shared<sphere>(point3(0,-1000,0), 1000, make_shared<lambertian>(checker)));

    for (int a = -11; a < 11; a++) {
        for (int b = -11; b < 11; b++) {
            auto choose_mat = random_double();
            point3 center(a + 0.9*random_double(), 0.2, b + 0.9*random_double());

            if ((center - point3(4, 0.2, 0)).length() > 0.9) {
                shared_ptr<material> sphere_material;

                if (choose_mat < 0.8) {
                    // diffuse
                    auto albedo = color::random() * color::random();
                    sphere_material = make_shared<lambertian>(albedo);
                    auto center2 = center + vec3(0, random_double(0,.5), 0);
                    world.add(make_shared<sphere>(center, center2, 0.2, sphere_material));
                } else if (choose_mat < 0.95) {
                    // metal
                    auto albedo = color::random(0.5, 1);
                    auto fuzz = random_double(0, 0.5);
                    sphere_material = make_shared<metal>(albedo, fuzz);
                    world.add(make_shared<sphere>(center, 0.2, sphere_material));
                } else {
                    // glass
                    sphere_material = make_shared<dielectric>(1.5);
                    world.add(make_shared<sphere>(center, 0.2, sphere_material));
                }
            }
        }
    }

    auto material1 = make_shared<dielectric>(1.5);
    world.add(make_shared<sphere>(point3(0, 1, 0), 1.0, material1));

    auto material2 = make_shared<lambertian>(color(0.4, 0.2, 0.1));
    world.add(make_shared<sphere>(point3(-4, 1, 0), 1.0, material2));

    auto material3 = make_shared<metal>(color(0.7, 0.6, 0.5), 0.0);
    world.add(make_shared<sphere>(point3(4, 1, 0), 1.0, material3));

    world = hittable_list(make_shared<bvh_node>(world));

    camera cam;

    cam.aspect_ratio      = 16.0 / 9.0;
    cam.image_width       = 400;
    cam.samples_per_pixel = 100;
    cam.max_depth         = 50;
    cam.background        = color(0.70, 0.80, 1.00);

    cam.vfov     = 20;
    cam.lookfrom = point3(13,2,3);
    cam.lookat   = point3(0,0,0);
    cam.vup      = vec3(0,1,0);

    cam.defocus_angle = 0.6;
    cam.focus_dist    = 10.0;

    cam.render(world);
}